

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O3

void sx_rng_seed(sx_rng *rng,uint32_t seed)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)seed * -0x15ca0502554e666 + 0xff51afd7ed558ccd;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  uVar2 = uVar1 * -0x1288180e36f55d89;
  uVar1 = uVar1 * -0x3b314601e57a13ad;
  uVar1 = uVar1 >> 0x21 ^ uVar1;
  rng->state[1] = uVar1 * 2 + 1;
  uVar2 = (uVar2 >> 0x21 ^ uVar2) * -0x3b314601e57a13ad;
  rng->state[0] =
       (uVar2 >> 0x21 ^ uVar2) * 0x5851f42d4c957f2d + uVar1 * -0x4f5c17a566d501a4 +
       0x5851f42d4c957f2e;
  return;
}

Assistant:

void sx_rng_seed(sx_rng* rng, uint32_t seed)
{
    uint64_t value = (((uint64_t)seed) << 1ull) | 1ull;    // make it odd
    value = sx__rng_avalanche64(value);
    rng->state[0] = 0ull;
    rng->state[1] = (value << 1ull) | 1ull;
    sx_rng_gen(rng);
    rng->state[0] += sx__rng_avalanche64(value);
    sx_rng_gen(rng);
}